

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

cmFileList * __thiscall cmFileList::operator/(cmFileList *this,cmFileListGeneratorBase *rhs)

{
  auto_ptr<cmFileListGeneratorBase> aVar1;
  auto_ptr<cmFileListGeneratorBase> aVar2;
  auto_ptr<cmFileListGeneratorBase> local_20;
  
  if (this->Last == (cmFileListGeneratorBase *)0x0) {
    (*rhs->_vptr_cmFileListGeneratorBase[3])(&local_20);
    aVar1.x_ = local_20.x_;
    local_20.x_ = (cmFileListGeneratorBase *)0x0;
    aVar2.x_ = (this->First).x_;
    if (aVar2.x_ != aVar1.x_) {
      if (aVar2.x_ == (cmFileListGeneratorBase *)0x0) {
        (this->First).x_ = aVar1.x_;
        aVar2.x_ = aVar1.x_;
      }
      else {
        (*(aVar2.x_)->_vptr_cmFileListGeneratorBase[1])();
        (this->First).x_ = aVar1.x_;
        aVar2.x_ = aVar1.x_;
        if (local_20.x_ != (cmFileListGeneratorBase *)0x0) {
          (*(local_20.x_)->_vptr_cmFileListGeneratorBase[1])();
          aVar2.x_ = (this->First).x_;
        }
      }
    }
  }
  else {
    aVar2.x_ = cmFileListGeneratorBase::SetNext(this->Last,rhs);
  }
  this->Last = aVar2.x_;
  return this;
}

Assistant:

cmFileList& operator/(cmFileListGeneratorBase const& rhs)
  {
    if (this->Last) {
      this->Last = this->Last->SetNext(rhs);
    } else {
      this->First = rhs.Clone();
      this->Last = this->First.get();
    }
    return *this;
  }